

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O0

var __thiscall cs::runtime_type::parse_access(runtime_type *this,var *a,var *b)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  numeric_integer nVar4;
  size_t sVar5;
  undefined8 uVar6;
  numeric *pnVar7;
  runtime_error *this_00;
  proxy *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *cstr;
  flat_hash_map<cs_impl::any,_cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
  *cmap;
  size_t i;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *arr;
  size_t posit;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *carr;
  numeric *in_stack_fffffffffffffd98;
  runtime_error *in_stack_fffffffffffffda0;
  type_info *in_stack_fffffffffffffda8;
  allocator *paVar8;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
  *in_stack_fffffffffffffdb0;
  key_arg<cs_impl::any> *in_stack_fffffffffffffdb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
  *in_stack_fffffffffffffdc0;
  numeric *in_stack_fffffffffffffdc8;
  any *in_stack_fffffffffffffe20;
  allocator local_1c1;
  string local_1c0 [16];
  any *in_stack_fffffffffffffe50;
  int local_19c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_198;
  undefined1 local_18a;
  allocator local_189;
  string local_188 [60];
  int local_14c;
  numeric local_148;
  EVP_PKEY_CTX local_120 [8];
  EVP_PKEY_CTX local_118 [8];
  flat_hash_map<cs_impl::any,_cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
  *local_110;
  undefined1 local_102;
  allocator local_101;
  string local_100 [32];
  size_type local_e0;
  numeric local_d8;
  int local_ac;
  numeric local_a8;
  long local_80;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *local_78;
  int local_6c;
  ulong local_68;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *local_60;
  undefined1 local_55;
  allocator local_41;
  string local_40 [64];
  
  cs_impl::any::type((any *)in_stack_fffffffffffffda0);
  bVar1 = std::type_info::operator==
                    ((type_info *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  if (bVar1) {
    cs_impl::any::type((any *)in_stack_fffffffffffffda0);
    bVar1 = std::type_info::operator!=
                      ((type_info *)in_stack_fffffffffffffda0,(type_info *)in_stack_fffffffffffffd98
                      );
    if (bVar1) {
      local_55 = 1;
      uVar6 = __cxa_allocate_exception(0x28);
      paVar8 = &local_41;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_40,"Index must be a numeric.",paVar8);
      runtime_error::runtime_error(in_stack_fffffffffffffda0,(string *)in_stack_fffffffffffffd98);
      local_55 = 0;
      __cxa_throw(uVar6,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    local_60 = cs_impl::any::const_val<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>
                         (in_stack_fffffffffffffe20);
    local_68 = 0;
    pnVar7 = cs_impl::any::const_val<cs::numeric>(in_stack_fffffffffffffe20);
    local_6c = 0;
    bVar1 = numeric::operator>=(pnVar7,&local_6c);
    if (bVar1) {
      pnVar7 = cs_impl::any::const_val<cs::numeric>(in_stack_fffffffffffffe20);
      uVar2 = numeric::as_integer(pnVar7);
      local_68 = uVar2;
      sVar3 = std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::size
                        ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)0x15ccf9);
      if (sVar3 <= uVar2) {
        local_78 = cs_impl::any::val<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>
                             (in_stack_fffffffffffffe50);
        uVar2 = local_68;
        sVar3 = std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::size
                          ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)0x15cd39);
        for (local_80 = (uVar2 - sVar3) + 1; local_80 != 0; local_80 = local_80 + -1) {
          local_ac = 0;
          numeric::numeric<int>(&local_a8,&local_ac);
          std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::emplace_back<cs::numeric>
                    ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_stack_fffffffffffffda0
                     ,in_stack_fffffffffffffd98);
        }
      }
    }
    else {
      cs_impl::any::const_val<cs::numeric>(in_stack_fffffffffffffe20);
      numeric::operator-(in_stack_fffffffffffffdc8);
      local_e0 = std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::size
                           ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)0x15cde1);
      bVar1 = numeric::operator>(&local_d8,&local_e0);
      if (bVar1) {
        local_102 = 1;
        uVar6 = __cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_100,"Out of range.",&local_101);
        runtime_error::runtime_error(in_stack_fffffffffffffda0,(string *)in_stack_fffffffffffffd98);
        local_102 = 0;
        __cxa_throw(uVar6,&runtime_error::typeinfo,runtime_error::~runtime_error);
      }
      sVar3 = std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::size
                        ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)0x15ceee);
      pnVar7 = cs_impl::any::const_val<cs::numeric>(in_stack_fffffffffffffe20);
      nVar4 = numeric::as_integer(pnVar7);
      local_68 = sVar3 + nVar4;
    }
    std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[]
              ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_stack_fffffffffffffda0,
               (size_type)in_stack_fffffffffffffd98);
    cs_impl::any::any((any *)in_stack_fffffffffffffda0,(any *)in_stack_fffffffffffffd98);
  }
  else {
    cs_impl::any::type((any *)in_stack_fffffffffffffda0);
    bVar1 = std::type_info::operator==
                      ((type_info *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    if (bVar1) {
      local_110 = cs_impl::any::
                  const_val<phmap::flat_hash_map<cs_impl::any,cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>>
                            (in_stack_fffffffffffffe20);
      sVar5 = phmap::priv::
              raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
              ::count<cs_impl::any>(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
      if (sVar5 == 0) {
        cs_impl::any::
        val<phmap::flat_hash_map<cs_impl::any,cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>>
                  (in_stack_fffffffffffffe50);
        cs_impl::any::any((any *)in_stack_fffffffffffffda0,(any *)in_stack_fffffffffffffd98);
        copy(local_118,local_120);
        local_14c = 0;
        numeric::numeric<int>(&local_148,&local_14c);
        phmap::priv::
        raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
        ::emplace<cs_impl::any,_cs::numeric,_0>
                  (in_stack_fffffffffffffdb0,(any *)in_stack_fffffffffffffda8,
                   (numeric *)in_stack_fffffffffffffda0);
        cs_impl::any::~any((any *)0x15d031);
        cs_impl::any::~any((any *)0x15d03e);
      }
      phmap::priv::
      raw_hash_map<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs_impl::any>,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>
      ::at<cs_impl::any,phmap::priv::FlatHashMapPolicy<cs_impl::any,cs_impl::any>>
                ((raw_hash_map<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
                  *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
      cs_impl::any::any((any *)in_stack_fffffffffffffda0,(any *)in_stack_fffffffffffffd98);
    }
    else {
      cs_impl::any::type((any *)in_stack_fffffffffffffda0);
      bVar1 = std::type_info::operator==
                        ((type_info *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      if (!bVar1) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
        paVar8 = &local_1c1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1c0,"Access non-array or string object.",paVar8);
        runtime_error::runtime_error(this_00,(string *)in_stack_fffffffffffffd98);
        __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
      }
      cs_impl::any::type((any *)in_stack_fffffffffffffda0);
      bVar1 = std::type_info::operator!=
                        ((type_info *)in_stack_fffffffffffffda0,
                         (type_info *)in_stack_fffffffffffffd98);
      if (bVar1) {
        local_18a = 1;
        uVar6 = __cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_188,"Index must be a numeric.",&local_189);
        runtime_error::runtime_error(in_stack_fffffffffffffda0,(string *)in_stack_fffffffffffffd98);
        local_18a = 0;
        __cxa_throw(uVar6,&runtime_error::typeinfo,runtime_error::~runtime_error);
      }
      local_198 = cs_impl::any::const_val<std::__cxx11::string>(in_stack_fffffffffffffe20);
      pnVar7 = cs_impl::any::const_val<cs::numeric>(in_stack_fffffffffffffe20);
      local_19c = 0;
      bVar1 = numeric::operator>=(pnVar7,&local_19c);
      if (bVar1) {
        pbVar9 = local_198;
        pnVar7 = cs_impl::any::const_val<cs::numeric>(in_stack_fffffffffffffe20);
        numeric::as_integer(pnVar7);
        std::__cxx11::string::operator[]((ulong)pbVar9);
        cs_impl::any::make_constant<char,char_const&>((char *)in_stack_fffffffffffffdb8);
      }
      else {
        pbVar9 = local_198;
        std::__cxx11::string::size();
        pnVar7 = cs_impl::any::const_val<cs::numeric>(in_stack_fffffffffffffe20);
        numeric::as_integer(pnVar7);
        std::__cxx11::string::operator[]((ulong)pbVar9);
        cs_impl::any::make_constant<char,char_const&>((char *)pbVar9);
      }
    }
  }
  return (var)in_RDI;
}

Assistant:

var runtime_type::parse_access(const var &a, const var &b)
	{
		if (a.type() == typeid(array)) {
			if (b.type() != typeid(numeric))
				throw runtime_error("Index must be a numeric.");
			const auto &carr = a.const_val<array>();
			std::size_t posit = 0;
			if (b.const_val<numeric>() >= 0) {
				posit = b.const_val<numeric>().as_integer();
				if (posit >= carr.size()) {
					auto &arr = a.val<array>();
					for (std::size_t i = posit - arr.size() + 1; i > 0; --i)
						arr.emplace_back(numeric(0));
				}
			}
			else {
				if (-b.const_val<numeric>() > carr.size())
					throw runtime_error("Out of range.");
				posit = carr.size() + b.const_val<numeric>().as_integer();
			}
			return carr[posit];
		}
		else if (a.type() == typeid(hash_map)) {
			const auto &cmap = a.const_val<hash_map>();
			if (cmap.count(b) == 0)
				a.val<hash_map>().emplace(copy(b), numeric(0));
			return cmap.at(b);
		}
		else if (a.type() == typeid(string)) {
			if (b.type() != typeid(numeric))
				throw runtime_error("Index must be a numeric.");
			const auto &cstr = a.const_val<string>();
			if (b.const_val<numeric>() >= 0)
				return var::make_constant<char>(cstr[b.const_val<numeric>().as_integer()]);
			else
				return var::make_constant<char>(cstr[cstr.size() + b.const_val<numeric>().as_integer()]);
		}
		else
			throw runtime_error("Access non-array or string object.");
	}